

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O0

void sigopcount_tests::BuildTxs
               (CMutableTransaction *spendingTx,CCoinsViewCache *coins,
               CMutableTransaction *creationTx,CScript *scriptPubKey,CScript *scriptSig,
               CScriptWitness *witness)

{
  reference pvVar1;
  reference pvVar2;
  CScript *in_RCX;
  long in_RDX;
  long in_RDI;
  size_type in_R8;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_R9;
  long in_FS_OFFSET;
  CTransaction *in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  CScript *__n;
  CScript *in_stack_fffffffffffffe88;
  size_type in_stack_fffffffffffffe90;
  CMutableTransaction *in_stack_fffffffffffffe98;
  CMutableTransaction *tx;
  CTransaction *this;
  undefined1 *puVar3;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffedc;
  CCoinsViewCache *in_stack_fffffffffffffee0;
  undefined1 local_e8 [128];
  undefined8 local_68;
  CMutableTransaction *pCStack_60;
  undefined8 local_58;
  CMutableTransaction *pCStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(in_RDX + 0x30) = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_fffffffffffffe98->vin,in_stack_fffffffffffffe90);
  uVar4 = 0;
  this = (CTransaction *)0x0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe80);
  COutPoint::SetNull((COutPoint *)in_stack_fffffffffffffe78);
  tx = (CMutableTransaction *)0x0;
  local_28._16_8_ = 0;
  local_28._24_8_ = 0;
  local_28._0_8_ = (char *)0x0;
  local_28._8_8_ = 0;
  __n = (CScript *)local_28;
  CScript::CScript((CScript *)in_stack_fffffffffffffe78);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe88,(size_type)__n);
  CScript::operator=(in_stack_fffffffffffffe88,__n);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe78);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90);
  pvVar1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe88,
                      (size_type)__n);
  pvVar1->nValue = 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_RCX,(size_type)__n);
  CScript::operator=(in_RCX,__n);
  *(undefined4 *)(in_RDI + 0x30) = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_fffffffffffffe98->vin,in_stack_fffffffffffffe90);
  CMutableTransaction::GetHash(in_stack_fffffffffffffe98);
  pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RCX,(size_type)__n);
  *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_38;
  *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_30;
  *(undefined8 *)(pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_48;
  *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_40;
  pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RCX,(size_type)__n);
  (pvVar2->prevout).n = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RCX,(size_type)__n);
  CScript::operator=(in_RCX,__n);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RCX,(size_type)__n);
  CScriptWitness::operator=((CScriptWitness *)in_RCX,(CScriptWitness *)__n);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(in_R9,in_R8);
  pvVar1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_RCX,(size_type)__n);
  pvVar1->nValue = 1;
  local_58 = 0;
  local_68 = 0;
  pCStack_60 = tx;
  pCStack_50 = tx;
  CScript::CScript((CScript *)in_stack_fffffffffffffe78);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_RCX,(size_type)__n);
  CScript::operator=(in_RCX,__n);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe78);
  puVar3 = local_e8;
  CTransaction::CTransaction(this,tx);
  AddCoins(in_stack_fffffffffffffee0,(CTransaction *)CONCAT44(in_stack_fffffffffffffedc,uVar4),
           (int)((ulong)puVar3 >> 0x20),SUB81((ulong)puVar3 >> 0x18,0));
  CTransaction::~CTransaction(in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void BuildTxs(CMutableTransaction& spendingTx, CCoinsViewCache& coins, CMutableTransaction& creationTx, const CScript& scriptPubKey, const CScript& scriptSig, const CScriptWitness& witness)
{
    creationTx.version = 1;
    creationTx.vin.resize(1);
    creationTx.vin[0].prevout.SetNull();
    creationTx.vin[0].scriptSig = CScript();
    creationTx.vout.resize(1);
    creationTx.vout[0].nValue = 1;
    creationTx.vout[0].scriptPubKey = scriptPubKey;

    spendingTx.version = 1;
    spendingTx.vin.resize(1);
    spendingTx.vin[0].prevout.hash = creationTx.GetHash();
    spendingTx.vin[0].prevout.n = 0;
    spendingTx.vin[0].scriptSig = scriptSig;
    spendingTx.vin[0].scriptWitness = witness;
    spendingTx.vout.resize(1);
    spendingTx.vout[0].nValue = 1;
    spendingTx.vout[0].scriptPubKey = CScript();

    AddCoins(coins, CTransaction(creationTx), 0);
}